

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

ON_3dPoint * __thiscall
ON_Mesh::Vertex(ON_3dPoint *__return_storage_ptr__,ON_Mesh *this,int vertex_index)

{
  uint uVar1;
  ON_3fPoint *pOVar2;
  ON_3dPoint *pOVar3;
  double dVar4;
  ON_3fPoint F;
  ON_3fPoint local_18;
  
  uVar1 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  if (vertex_index < 0 || uVar1 <= (uint)vertex_index) {
    __return_storage_ptr__->z = ON_3dPoint::UnsetPoint.z;
    dVar4 = ON_3dPoint::UnsetPoint.y;
    __return_storage_ptr__->x = ON_3dPoint::UnsetPoint.x;
    __return_storage_ptr__->y = dVar4;
  }
  else {
    pOVar2 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
    local_18.z = pOVar2[(uint)vertex_index].z;
    pOVar2 = pOVar2 + (uint)vertex_index;
    local_18.x = pOVar2->x;
    local_18.y = pOVar2->y;
    if (uVar1 == (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count) {
      pOVar3 = (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a;
      __return_storage_ptr__->z = pOVar3[(uint)vertex_index].z;
      pOVar3 = pOVar3 + (uint)vertex_index;
      dVar4 = pOVar3->y;
      __return_storage_ptr__->x = pOVar3->x;
      __return_storage_ptr__->y = dVar4;
      if ((local_18.x == (float)__return_storage_ptr__->x) &&
         (!NAN(local_18.x) && !NAN((float)__return_storage_ptr__->x))) {
        if ((local_18.y == (float)__return_storage_ptr__->y) &&
           (!NAN(local_18.y) && !NAN((float)__return_storage_ptr__->y))) {
          if ((local_18.z == (float)__return_storage_ptr__->z) &&
             (!NAN(local_18.z) && !NAN((float)__return_storage_ptr__->z))) {
            return __return_storage_ptr__;
          }
        }
      }
    }
    ON_3dPoint::ON_3dPoint(__return_storage_ptr__,&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dPoint ON_Mesh::Vertex(int vertex_index) const
{
  const unsigned int vertex_count = m_V.UnsignedCount();
  if ( vertex_index < 0 || ((unsigned int)vertex_index) >= vertex_count )
    return ON_3dPoint::UnsetPoint;

  const ON_3fPoint F = m_V[vertex_index];
  if (vertex_count == m_dV.UnsignedCount())
  {
    ON_3dPoint D = m_dV[vertex_index];
    if ( F.x == (float)D.x && F.y == (float)D.y && F.z == (float)D.z )
    {
      // double precision vertex is valid
      return D;
    }
  }

  return F;
}